

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineClearUtil.cpp
# Opt level: O3

IVec4 __thiscall vkt::pipeline::defaultClearColorInt(pipeline *this,TextureFormat *format)

{
  undefined8 extraout_RDX;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  IVec4 IVar6;
  TextureFormatInfo formatInfo;
  TextureFormatInfo local_50;
  
  tcu::getTextureFormatInfo(&local_50,format);
  auVar5._0_4_ = 0.39 - local_50.lookupBias.m_data[0];
  auVar5._4_4_ = 0.58 - local_50.lookupBias.m_data[1];
  auVar5._8_4_ = 0.93 - local_50.lookupBias.m_data[2];
  auVar5._12_4_ = 1.0 - local_50.lookupBias.m_data[3];
  auVar5 = divps(auVar5,(undefined1  [16])local_50.lookupScale.m_data);
  fVar1 = floorf(auVar5._12_4_ + 0.5);
  fVar2 = floorf(auVar5._8_4_ + 0.5);
  fVar3 = floorf(auVar5._0_4_ + 0.5);
  fVar4 = floorf(auVar5._4_4_ + 0.5);
  *(int *)this = (int)fVar3;
  *(int *)(this + 4) = (int)fVar4;
  *(int *)(this + 8) = (int)fVar2;
  *(int *)(this + 0xc) = (int)fVar1;
  IVar6.m_data[2] = (int)extraout_RDX;
  IVar6.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar6.m_data._0_8_ = this;
  return (IVec4)IVar6.m_data;
}

Assistant:

tcu::IVec4 defaultClearColorInt (const tcu::TextureFormat& format)
{
	const tcu::TextureFormatInfo	formatInfo	= tcu::getTextureFormatInfo(format);
	const tcu::Vec4					color		= (defaultClearColorUnorm() - formatInfo.lookupBias) / formatInfo.lookupScale;

	const tcu::IVec4				result		((deInt32)deFloatRound(color.x()), (deInt32)deFloatRound(color.y()),
												 (deInt32)deFloatRound(color.z()), (deInt32)deFloatRound(color.w()));

	return result;
}